

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suggest_piece.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::suggest_piece::add_piece
          (suggest_piece *this,piece_index_t index,int availability,int max_queue_size)

{
  int iVar1;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  __dest;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar2;
  iterator __position;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar3;
  int iVar4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar5;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_24;
  
  if ((this->m_availability).m_num_samples < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = (this->m_availability).m_mean;
    iVar1 = iVar4 + 0x20;
    iVar4 = iVar4 + 0x5f;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    iVar4 = iVar4 >> 6;
  }
  sliding_average<int,_30>::add_sample(&this->m_availability,availability);
  if (availability <= iVar4) {
    __dest = ::std::
             __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                       ((this->m_priority_pieces).
                        super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        .
                        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->m_priority_pieces).
                        super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        .
                        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_24);
    psVar3 = (this->m_priority_pieces).
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (this->m_priority_pieces).
         super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         .
         super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__dest._M_current != __position._M_current) {
      psVar5 = __dest._M_current + 1;
      if (psVar5 != __position._M_current) {
        memmove(__dest._M_current,psVar5,(long)__position._M_current - (long)psVar5);
        psVar3 = (this->m_priority_pieces).
                 super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current =
             (this->m_priority_pieces).
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      __position._M_current = __position._M_current + -1;
      (this->m_priority_pieces).
      super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
    }
    iVar4 = (int)((ulong)((long)__position._M_current - (long)psVar3) >> 2);
    if ((max_queue_size <= iVar4) &&
       (psVar5 = psVar3 + (long)(iVar4 - max_queue_size) + 1, psVar3 != psVar5)) {
      psVar2 = psVar5;
      if ((long)__position._M_current - (long)psVar5 != 0) {
        memmove(psVar3,psVar5,(long)__position._M_current - (long)psVar5);
        __position._M_current =
             (this->m_priority_pieces).
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        psVar2 = __position._M_current;
      }
      psVar3 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ((long)psVar3 + ((long)psVar2 - (long)psVar5));
      if (__position._M_current != psVar3) {
        (this->m_priority_pieces).
        super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        .
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar3;
        __position._M_current = psVar3;
      }
    }
    if (__position._M_current ==
        (this->m_priority_pieces).
        super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        .
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
      ::
      _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                  *)this,__position,&local_24);
    }
    else {
      (__position._M_current)->m_val = index.m_val;
      (this->m_priority_pieces).
      super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void add_piece(piece_index_t const index, int const availability
		, int const max_queue_size)
	{
		// keep a running average of the availability of pieces, and filter
		// anything above average.
		int const mean = m_availability.mean();
		m_availability.add_sample(availability);

		if (availability > mean) return;

		auto const it = std::find(m_priority_pieces.begin()
			, m_priority_pieces.end(), index);

		if (it != m_priority_pieces.end())
		{
			// increase the priority of this piece by moving it to the front
			// of the queue
			m_priority_pieces.erase(it);
		}

		if (int(m_priority_pieces.size()) >= max_queue_size)
		{
			int const to_remove = int(m_priority_pieces.size()) - max_queue_size + 1;
			m_priority_pieces.erase(m_priority_pieces.begin()
				, m_priority_pieces.begin() + to_remove);
		}

		m_priority_pieces.push_back(index);
	}